

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O2

void __thiscall MeCab::Writer::Writer(Writer *this)

{
  this->_vptr_Writer = (_func_int **)&PTR__Writer_00139d70;
  scoped_string::scoped_string(&this->node_format_);
  scoped_string::scoped_string(&this->bos_format_);
  scoped_string::scoped_string(&this->eos_format_);
  scoped_string::scoped_string(&this->unk_format_);
  scoped_string::scoped_string(&this->eon_format_);
  whatlog::whatlog(&this->what_);
  this->write_ = (offset_in_Writer_to_subr)writeLattice;
  *(undefined8 *)&this->field_0x1f8 = 0;
  return;
}

Assistant:

Writer::Writer() : write_(&Writer::writeLattice) {}